

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueArrayCase::test(UniformValueArrayCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  TestContext *pTVar1;
  deUint32 dVar2;
  GLint GVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  byte bVar7;
  float uniformValue [20];
  ShaderProgram program;
  undefined1 local_218 [8];
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_188;
  undefined1 local_168 [40];
  value_type local_140;
  value_type local_120;
  ShaderProgram local_100;
  
  bVar7 = 0;
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "uniform highp float arrayUniform[5];uniform highp vec2 array2Uniform[5];uniform highp vec3 array3Uniform[5];uniform highp vec4 array4Uniform[5];void main (void)\n{\n\tgl_Position = \n\t\t+ vec4(arrayUniform[0]\t\t+ arrayUniform[1]\t\t+ arrayUniform[2]\t\t+ arrayUniform[3]\t\t+ arrayUniform[4])\n\t\t+ vec4(array2Uniform[0].x\t+ array2Uniform[1].x\t+ array2Uniform[2].x\t+ array2Uniform[3].x\t+ array2Uniform[4].x)\n\t\t+ vec4(array3Uniform[0].x\t+ array3Uniform[1].x\t+ array3Uniform[2].x\t+ array3Uniform[3].x\t+ array3Uniform[4].x)\n\t\t+ vec4(array4Uniform[0].x\t+ array4Uniform[1].x\t+ array4Uniform[2].x\t+ array4Uniform[3].x\t+ array4Uniform[4].x);\n}\n"
             ,"");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n","");
  local_168[0x10] = 0;
  local_168._17_8_ = 0;
  local_168._0_8_ = (pointer)0x0;
  local_168[8] = 0;
  local_168._9_7_ = 0;
  memset(local_218,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_218,&local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_200,&local_140);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_188);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_218 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&local_100);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,local_100.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    puVar4 = &DAT_01c1aba0;
    puVar5 = (undefined8 *)local_218;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    }
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"arrayUniform");
    glu::CallLogWrapper::glUniform1fv(this_00,GVar3,5,(GLfloat *)local_218);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"arrayUniform[0]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,(float)local_218._0_4_);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"arrayUniform[1]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,(float)local_218._4_4_);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"arrayUniform[2]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,local_210);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"arrayUniform[3]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,local_20c);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"arrayUniform[4]");
    verifyUniformValue1f(pTVar1,this_00,dVar2,GVar3,local_208);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array2Uniform");
    glu::CallLogWrapper::glUniform2fv(this_00,GVar3,5,(GLfloat *)local_218);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array2Uniform[0]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,(float)local_218._0_4_,(float)local_218._4_4_);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array2Uniform[1]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,local_210,local_20c);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array2Uniform[2]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,local_208,local_204);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array2Uniform[3]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,local_200,local_1fc);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array2Uniform[4]");
    verifyUniformValue2f(pTVar1,this_00,dVar2,GVar3,local_1f8,local_1f4);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array3Uniform");
    glu::CallLogWrapper::glUniform3fv(this_00,GVar3,5,(GLfloat *)local_218);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array3Uniform[0]");
    verifyUniformValue3f
              (pTVar1,this_00,dVar2,GVar3,(float)local_218._0_4_,(float)local_218._4_4_,local_210);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array3Uniform[1]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,local_20c,local_208,local_204);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array3Uniform[2]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,local_200,local_1fc,local_1f8);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array3Uniform[3]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,local_1f4,local_1f0,local_1ec);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array3Uniform[4]");
    verifyUniformValue3f(pTVar1,this_00,dVar2,GVar3,local_1e8,local_1e4,local_1e0);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array4Uniform");
    glu::CallLogWrapper::glUniform4fv(this_00,GVar3,5,(GLfloat *)local_218);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array4Uniform[0]");
    verifyUniformValue4f
              (pTVar1,this_00,dVar2,GVar3,(float)local_218._0_4_,(float)local_218._4_4_,local_210,
               local_20c);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array4Uniform[1]");
    verifyUniformValue4f(pTVar1,this_00,dVar2,GVar3,local_208,local_204,local_200,local_1fc);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array4Uniform[2]");
    verifyUniformValue4f(pTVar1,this_00,dVar2,GVar3,local_1f8,local_1f4,local_1f0,local_1ec);
    dVar2 = local_100.m_program.m_program;
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array4Uniform[3]");
    verifyUniformValue4f(pTVar1,this_00,dVar2,GVar3,local_1e8,local_1e4,local_1e0,local_1dc);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_100.m_program.m_program,"array4Uniform[4]");
    verifyUniformValue4f
              (pTVar1,this_00,local_100.m_program.m_program,GVar3,local_1d8,local_1d4,local_1d0,
               local_1cc);
    ApiCase::expectError(&this->super_ApiCase,0);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp float arrayUniform[5];"
			"uniform highp vec2 array2Uniform[5];"
			"uniform highp vec3 array3Uniform[5];"
			"uniform highp vec4 array4Uniform[5];"
			"void main (void)\n"
			"{\n"
			"	gl_Position = \n"
			"		+ vec4(arrayUniform[0]		+ arrayUniform[1]		+ arrayUniform[2]		+ arrayUniform[3]		+ arrayUniform[4])\n"
			"		+ vec4(array2Uniform[0].x	+ array2Uniform[1].x	+ array2Uniform[2].x	+ array2Uniform[3].x	+ array2Uniform[4].x)\n"
			"		+ vec4(array3Uniform[0].x	+ array3Uniform[1].x	+ array3Uniform[2].x	+ array3Uniform[3].x	+ array3Uniform[4].x)\n"
			"		+ vec4(array4Uniform[0].x	+ array4Uniform[1].x	+ array4Uniform[2].x	+ array4Uniform[3].x	+ array4Uniform[4].x);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		float uniformValue[5 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
			95.0f,	77.0f,	32.0f,	48.0f
		};

		location = glGetUniformLocation(program.getProgram(), "arrayUniform");
		glUniform1fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[0]"), uniformValue[0]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[1]"), uniformValue[1]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[2]"), uniformValue[2]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[3]"), uniformValue[3]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[4]"), uniformValue[4]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array2Uniform");
		glUniform2fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[0]"), uniformValue[2 * 0], uniformValue[(2 * 0) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[1]"), uniformValue[2 * 1], uniformValue[(2 * 1) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[2]"), uniformValue[2 * 2], uniformValue[(2 * 2) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[3]"), uniformValue[2 * 3], uniformValue[(2 * 3) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[4]"), uniformValue[2 * 4], uniformValue[(2 * 4) + 1]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array3Uniform");
		glUniform3fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[0]"), uniformValue[3 * 0], uniformValue[(3 * 0) + 1], uniformValue[(3 * 0) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[1]"), uniformValue[3 * 1], uniformValue[(3 * 1) + 1], uniformValue[(3 * 1) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[2]"), uniformValue[3 * 2], uniformValue[(3 * 2) + 1], uniformValue[(3 * 2) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[3]"), uniformValue[3 * 3], uniformValue[(3 * 3) + 1], uniformValue[(3 * 3) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[4]"), uniformValue[3 * 4], uniformValue[(3 * 4) + 1], uniformValue[(3 * 4) + 2]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array4Uniform");
		glUniform4fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[0]"), uniformValue[4 * 0], uniformValue[(4 * 0) + 1], uniformValue[(4 * 0) + 2], uniformValue[(4 * 0) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[1]"), uniformValue[4 * 1], uniformValue[(4 * 1) + 1], uniformValue[(4 * 1) + 2], uniformValue[(4 * 1) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[2]"), uniformValue[4 * 2], uniformValue[(4 * 2) + 1], uniformValue[(4 * 2) + 2], uniformValue[(4 * 2) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[3]"), uniformValue[4 * 3], uniformValue[(4 * 3) + 1], uniformValue[(4 * 3) + 2], uniformValue[(4 * 3) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[4]"), uniformValue[4 * 4], uniformValue[(4 * 4) + 1], uniformValue[(4 * 4) + 2], uniformValue[(4 * 4) + 3]);
		expectError(GL_NO_ERROR);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}